

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

size_t get_size<std::vector<example::option_t,std::allocator<example::option_t>>>(const_buffer buf)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 local_60 [8];
  vector<example::option_t,_std::allocator<example::option_t>_> v;
  undefined1 local_38 [8];
  sizer s;
  const_buffer buf_local;
  
  v.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)buf.data_;
  s.opts_.super_type.m_storage.dummy_ =
       (dummy_u)v.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  detail::sizer::sizer((sizer *)local_38,buf);
  std::vector<example::option_t,_std::allocator<example::option_t>_>::vector
            ((vector<example::option_t,_std::allocator<example::option_t>_> *)local_60);
  detail::sizer::operator()
            ((sizer *)local_38,
             (vector<example::option_t,_std::allocator<example::option_t>_> *)local_60);
  sVar1 = boost::asio::buffer_size<boost::asio::const_buffer>
                    ((const_buffer *)&s.opts_.super_type.m_storage);
  sVar2 = boost::asio::buffer_size<boost::asio::const_buffer>((const_buffer *)local_38);
  std::vector<example::option_t,_std::allocator<example::option_t>_>::~vector
            ((vector<example::option_t,_std::allocator<example::option_t>_> *)local_60);
  detail::sizer::~sizer((sizer *)local_38);
  return sVar1 - sVar2;
}

Assistant:

size_t get_size(asio::const_buffer buf) {
    detail::sizer s(buf);
    T v;
    s(v);
    return asio::buffer_size(buf) - asio::buffer_size(s.buf_);
}